

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pic.cpp
# Opt level: O3

int replacePic(istream *in,ostream *output,path *replacementFile)

{
  undefined8 *puVar1;
  ushort uVar2;
  pointer pMVar3;
  pointer pMVar4;
  pointer pCVar5;
  ostream *stream;
  uint uVar6;
  int iVar7;
  PicChunk *chunk;
  pointer pPVar8;
  Point PVar9;
  iterator iVar10;
  ulong uVar11;
  pointer this;
  size_t sVar12;
  size_t __n;
  ulong uVar13;
  _Tp_alloc_type *__alloc;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  Size section;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  pointer __last;
  ChunkData *chunk_1;
  ulong uVar22;
  Compressor compressor;
  Image replacement;
  PicHeader header;
  unordered_map<Image,_std::pair<unsigned_int,_unsigned_int>,_image_hash,_std::equal_to<Image>,_std::allocator<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>_>_>
  seen;
  pointer local_1c8;
  size_t local_1c0;
  pointer local_1b8;
  vector<ChunkData,_std::allocator<ChunkData>_> local_1a8;
  pointer local_188;
  ulong local_180;
  Image local_178;
  Compressor local_150;
  ulong local_148;
  ulong local_140;
  Image local_138;
  Size local_118;
  pointer local_110;
  pointer pMStack_108;
  pointer local_100;
  pointer local_f8;
  pointer pMStack_f0;
  pointer local_e8;
  uint16_t local_e0;
  uint16_t uStack_de;
  uint16_t uStack_dc;
  uint16_t uStack_da;
  uint16_t uStack_d8;
  undefined2 uStack_d6;
  uint32_t uStack_d4;
  ostream *local_d0;
  istream *local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  PicHeader local_98;
  _Hashtable<Image,_std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<Image>,_image_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_98.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_98.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8 = in;
  operator>>(in,&local_98);
  if (local_98.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_98.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar22 = 0x400;
    uVar17 = 0x400;
  }
  else {
    uVar6 = 0x400;
    uVar15 = 0x400;
    pPVar8 = local_98.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      uVar2 = pPVar8->x;
      uVar17 = (ulong)uVar2;
      if (uVar6 < uVar2) {
        uVar17 = (ulong)uVar6;
      }
      if (uVar2 < 0x41) {
        uVar17 = (ulong)uVar6;
      }
      uVar2 = pPVar8->y;
      uVar6 = (uint)uVar2;
      if (uVar15 < uVar2) {
        uVar6 = uVar15;
      }
      if (uVar2 < 0x41) {
        uVar6 = uVar15;
      }
      uVar15 = uVar6;
      uVar22 = (ulong)uVar15;
      pPVar8 = pPVar8 + 1;
      uVar6 = (uint)uVar17;
    } while (pPVar8 != local_98.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  printf("Using %dx%d chunks\n",uVar17,uVar22);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  Compressor::Compressor(&local_150);
  Image::readPNG(&local_138,replacementFile);
  local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<PicChunk,_std::allocator<PicChunk>_>::resize
            (&local_98.chunks,
             (long)((((int)uVar22 + local_138.size.height + -1) / (int)uVar22) *
                   ((local_138.size.width + (int)uVar17 + -1) / (int)uVar17)));
  local_1c0 = PicHeader::binSize(&local_98);
  local_178.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_178.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_178.size.width = 0;
  local_178.size.height = 0;
  local_178.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  __n = 0;
  local_d0 = output;
  if (local_138.size.height < 1) {
    local_1c8 = (pointer)0x0;
  }
  else {
    local_188 = (pointer)0x0;
    __last = (pointer)0x0;
    local_1c8 = (pointer)0x0;
    local_180 = 0;
    iVar14 = local_138.size.height;
    iVar18 = local_138.size.width;
    local_c0 = uVar22;
    local_b8 = uVar17;
    do {
      if (0 < iVar18) {
        uVar15 = iVar14 - (int)local_180;
        local_148 = (ulong)uVar15;
        if ((int)uVar22 < (int)uVar15) {
          local_148 = uVar22 & 0xffffffff;
        }
        local_148 = local_148 << 0x20;
        local_a0 = local_180 << 0x20;
        lVar21 = (long)(int)__n * 0xc + 8;
        iVar7 = 0;
        uVar20 = 0;
        do {
          uVar22 = (ulong)(uint)(iVar18 + iVar7);
          if ((int)uVar17 < iVar18 + iVar7) {
            uVar22 = uVar17 & 0xffffffff;
          }
          section = (Size)(local_148 | uVar22);
          local_178.size = section;
          local_140 = __n;
          std::vector<Color,_std::allocator<Color>_>::resize
                    (&local_178.colorData,(long)(uVar22 * local_148) >> 0x20);
          Image::drawOnto(&local_138,&local_178,(Point)0x0,(Point)(uVar20 | local_a0),section);
          PVar9 = shrinkChunk(&local_178);
          pPVar8 = local_98.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
                   super__Vector_impl_data._M_start;
          *(short *)((long)local_98.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar21 + -8) =
               (short)PVar9.x + (short)uVar20;
          *(short *)((long)local_98.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>.
                           _M_impl.super__Vector_impl_data._M_start + lVar21 + -6) =
               (short)PVar9.y + (short)local_180;
          iVar10 = std::
                   _Hashtable<Image,_std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<Image>,_image_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&local_68,&local_178);
          if (iVar10.
              super__Node_iterator_base<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>,_true>
              ._M_cur == (__node_type *)0x0) {
            uVar6 = (int)local_1c0 + 0xf;
            uVar15 = (int)local_1c0 + 0x1e;
            if (-1 < (int)uVar6) {
              uVar15 = uVar6;
            }
            uVar22 = (ulong)local_178.size >> 0x20 & 0xffff;
            if (__last == local_188) {
              uVar17 = (long)local_188 - (long)local_1c8;
              if (uVar17 == 0x7ffffffffffffff8) {
                local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
                super__Vector_impl_data._M_start = local_1c8;
                std::__throw_length_error("vector::_M_realloc_insert");
              }
              uVar11 = ((long)uVar17 >> 3) * 0x4ec4ec4ec4ec4ec5;
              uVar13 = uVar11;
              if (local_188 == local_1c8) {
                uVar13 = 1;
              }
              uVar16 = uVar13 + uVar11;
              if (0x13b13b13b13b13a < uVar16) {
                uVar16 = 0x13b13b13b13b13b;
              }
              __alloc = (_Tp_alloc_type *)(uVar13 + uVar11);
              uVar19 = 0x13b13b13b13b13b;
              if (!CARRY8(uVar13,uVar11)) {
                uVar19 = uVar16;
              }
              local_188 = (pointer)(uVar19 * 0x68);
              local_b0 = uVar22;
              local_a8 = (ulong)local_178.size & 0xffff;
              local_1b8 = (pointer)operator_new((ulong)local_188);
              puVar1 = (undefined8 *)((long)local_1b8 + uVar17 + 0x50);
              *puVar1 = 0;
              puVar1[1] = 0;
              puVar1 = (undefined8 *)((long)local_1b8 + uVar17 + 0x40);
              *puVar1 = 0;
              puVar1[1] = 0;
              puVar1 = (undefined8 *)((long)local_1b8 + uVar17 + 0x30);
              *puVar1 = 0;
              puVar1[1] = 0;
              puVar1 = (undefined8 *)((long)local_1b8 + uVar17 + 0x20);
              *puVar1 = 0;
              puVar1[1] = 0;
              puVar1 = (undefined8 *)((long)local_1b8 + uVar17 + 0x10);
              *puVar1 = 0;
              puVar1[1] = 0;
              *(undefined8 *)((long)local_1b8 + uVar17) = 0;
              ((undefined8 *)((long)local_1b8 + uVar17))[1] = 0;
              *(undefined8 *)((long)local_1b8 + uVar17 + 0x60) = 0;
              this = std::vector<ChunkData,_std::allocator<ChunkData>_>::_S_relocate
                               (local_1c8,__last,local_1b8,__alloc);
              if (local_1c8 != (pointer)0x0) {
                operator_delete(local_1c8,uVar17);
              }
              local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   (pointer)((long)&(local_1b8->header).type + (long)local_188);
              uVar17 = local_b8;
              uVar13 = local_a8;
              uVar22 = local_b0;
              local_188 = local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage;
            }
            else {
              (__last->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              (__last->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (__last->header).h = 0;
              *(undefined2 *)&(__last->header).field_0x42 = 0;
              (__last->header).size = 0;
              (__last->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (__last->header).transparentMasks.
              super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (__last->header).alignmentWords = 0;
              (__last->header).x = 0;
              (__last->header).y = 0;
              (__last->header).w = 0;
              (__last->header).transparentMasks.
              super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              (__last->header).transparentMasks.
              super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              (__last->header).masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl
              .super__Vector_impl_data._M_finish = (pointer)0x0;
              (__last->header).masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl
              .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              *(undefined8 *)&__last->header = 0;
              (__last->header).masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl
              .super__Vector_impl_data._M_start = (pointer)0x0;
              *(undefined8 *)&__last->offset = 0;
              local_1b8 = local_1c8;
              uVar13 = (ulong)local_178.size & 0xffff;
              this = __last;
            }
            __last = this + 1;
            local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
            super__Vector_impl_data._M_finish = __last;
            Compressor::encodeChunk
                      ((ChunkHeader *)&local_118,&local_150,&this->data,&local_178,
                       (MaskRect)(uVar13 << 0x20 | uVar22 << 0x30),(Point)0x0,local_98.isSwitch);
            (this->header).type = (Type)local_118.width;
            pMVar3 = (this->header).masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pMVar4 = (this->header).masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage;
            (this->header).masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
            super__Vector_impl_data._M_start = local_110;
            (this->header).masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
            super__Vector_impl_data._M_finish = pMStack_108;
            (this->header).masks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = local_100;
            local_110 = (pointer)0x0;
            pMStack_108 = (pointer)0x0;
            local_100 = (pointer)0x0;
            if (pMVar3 != (pointer)0x0) {
              operator_delete(pMVar3,(long)pMVar4 - (long)pMVar3);
            }
            pMVar3 = (this->header).transparentMasks.
                     super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pMVar4 = (this->header).transparentMasks.
                     super__Vector_base<MaskRect,_std::allocator<MaskRect>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            (this->header).transparentMasks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
            _M_impl.super__Vector_impl_data._M_start = local_f8;
            (this->header).transparentMasks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
            _M_impl.super__Vector_impl_data._M_finish = pMStack_f0;
            (this->header).transparentMasks.super__Vector_base<MaskRect,_std::allocator<MaskRect>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = local_e8;
            local_f8 = (pointer)0x0;
            pMStack_f0 = (pointer)0x0;
            local_e8 = (pointer)0x0;
            if (pMVar3 != (pointer)0x0) {
              operator_delete(pMVar3,(long)pMVar4 - (long)pMVar3);
            }
            (this->header).alignmentWords = local_e0;
            (this->header).x = uStack_de;
            (this->header).y = uStack_dc;
            (this->header).w = uStack_da;
            (this->header).h = uStack_d8;
            *(undefined2 *)&(this->header).field_0x42 = uStack_d6;
            (this->header).size = uStack_d4;
            if (local_f8 != (pointer)0x0) {
              operator_delete(local_f8,(long)local_e8 - (long)local_f8);
            }
            if (local_110 != (pointer)0x0) {
              operator_delete(local_110,(long)local_100 - (long)local_110);
            }
            uVar15 = uVar15 & 0xfffffff0;
            this->offset = uVar15;
            *(uint *)((long)pPVar8 + lVar21 + -4) = uVar15;
            sVar12 = ChunkHeader::calcAlignmentGetBinSize(&this->header);
            *(int *)((long)&pPVar8->x + lVar21) =
                 ((int)sVar12 +
                 *(int *)&(this->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish) -
                 *(int *)&(this->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
            local_f8 = *(pointer *)((long)pPVar8 + lVar21 + -4);
            local_118 = local_178.size;
            local_110 = (pointer)local_178.colorData.
                                 super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                                 super__Vector_impl_data._M_start;
            pMStack_108 = (pointer)local_178.colorData.
                                   super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                                   super__Vector_impl_data._M_finish;
            local_100 = (pointer)local_178.colorData.
                                 super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage;
            local_178.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_178.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_178.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::
            _Hashtable<Image,std::pair<Image_const,std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<Image_const,std::pair<unsigned_int,unsigned_int>>>,std::__detail::_Select1st,std::equal_to<Image>,image_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::pair<Image,std::pair<unsigned_int,unsigned_int>>>
                      ((_Hashtable<Image,std::pair<Image_const,std::pair<unsigned_int,unsigned_int>>,std::allocator<std::pair<Image_const,std::pair<unsigned_int,unsigned_int>>>,std::__detail::_Select1st,std::equal_to<Image>,image_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)&local_68,(ChunkHeader *)&local_118);
            if (local_110 != (pointer)0x0) {
              operator_delete(local_110,(long)local_100 - (long)local_110);
            }
            local_1c0 = (size_t)(uVar15 + *(int *)((long)&pPVar8->x + lVar21));
            local_1c8 = local_1b8;
            iVar14 = (int)local_140;
          }
          else {
            *(undefined8 *)((long)pPVar8 + lVar21 + -4) =
                 *(undefined8 *)
                  ((long)iVar10.
                         super__Node_iterator_base<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>,_true>
                         ._M_cur + 0x28);
            iVar14 = (int)local_140;
          }
          uVar15 = (int)uVar20 + (int)uVar17;
          uVar20 = (ulong)uVar15;
          lVar21 = lVar21 + 0xc;
          __n = (size_t)(iVar14 + 1);
          iVar7 = iVar7 - (int)uVar17;
          uVar22 = local_c0;
          iVar14 = local_138.size.height;
          iVar18 = local_138.size.width;
        } while ((int)uVar15 < local_138.size.width);
      }
      local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
      super__Vector_impl_data._M_start = local_1c8;
      uVar15 = (int)local_180 + (int)uVar22;
      local_180 = (ulong)uVar15;
    } while ((int)uVar15 < iVar14);
  }
  stream = local_d0;
  local_98.filesize = (uint32_t)local_1c0;
  PicHeader::write(&local_98,(int)local_d0,local_c8,__n);
  pCVar5 = local_1a8.super__Vector_base<ChunkData,_std::allocator<ChunkData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (; local_1c8 != pCVar5; local_1c8 = local_1c8 + 1) {
    std::ostream::seekp((long)stream,local_1c8->offset);
    operator<<(stream,&local_1c8->header);
    std::ostream::write((char *)stream,
                        (long)(local_1c8->data).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_178.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_178.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_178.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<ChunkData,_std::allocator<ChunkData>_>::~vector(&local_1a8);
  if (local_138.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_138.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  Compressor::~Compressor(&local_150);
  std::
  _Hashtable<Image,_std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_Image,_std::pair<unsigned_int,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<Image>,_image_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  if (local_98.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.chunks.super__Vector_base<PicChunk,_std::allocator<PicChunk>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int replacePic(std::istream &in, std::ostream &output, const fs::path &replacementFile) {
	PicHeader header;
	in >> header;

	int CHUNK_WIDTH = 1024;
	int CHUNK_HEIGHT = 1024;

	for (const auto& chunk : header.chunks) {
		if (chunk.x > 64 && chunk.x < CHUNK_WIDTH) {
			CHUNK_WIDTH = chunk.x;
		}
		if (chunk.y > 64 && chunk.y < CHUNK_HEIGHT) {
			CHUNK_HEIGHT = chunk.y;
		}
	}

	printf("Using %dx%d chunks\n", CHUNK_WIDTH, CHUNK_HEIGHT);

	std::unordered_map<Image, std::pair<uint32_t, uint32_t>, image_hash> seen;

	Compressor compressor;
	Image replacement = Image::readPNG(replacementFile);
	struct ChunkData {
		ChunkHeader header;
		std::vector<uint8_t> data;
		uint32_t offset;
	};
	std::vector<ChunkData> data;
	std::vector<PicChunk> chunkEntries;
	Size sizeInChunks = {(replacement.size.width + CHUNK_WIDTH - 1) / CHUNK_WIDTH, (replacement.size.height + CHUNK_HEIGHT - 1) / CHUNK_HEIGHT};
	header.chunks.resize(sizeInChunks.area());
	int pos = header.binSize();
	Image chunk;
	int headerIdx = 0;
	for (int y1 = 0; y1 < replacement.size.height; y1 += CHUNK_HEIGHT) {
		int height = std::min(replacement.size.height - y1, CHUNK_HEIGHT);
		for (int x1 = 0; x1 < replacement.size.width; x1 += CHUNK_WIDTH) {
			int width = std::min(replacement.size.width - x1, CHUNK_WIDTH);
			chunk.fastResize({width, height});
			replacement.drawOnto(chunk, {0, 0}, {x1, y1}, {width, height});
			Point shrink = shrinkChunk(chunk);

			auto& headerEntry = header.chunks[headerIdx];
			headerIdx++;
			headerEntry.x = x1 + shrink.x;
			headerEntry.y = y1 + shrink.y;

			auto found = seen.find(chunk);
			if (found == seen.end()) {
				pos = (pos + 15) / 16 * 16;
				MaskRect bounds = {0, 0, static_cast<uint16_t>(chunk.size.width), static_cast<uint16_t>(chunk.size.height)};
				data.emplace_back();
				auto& chunkEntry = data.back();
				chunkEntry.header = compressor.encodeChunk(chunkEntry.data, chunk, bounds, {0, 0}, header.isSwitch);
				chunkEntry.offset = pos;

				headerEntry.offset = pos;
				headerEntry.size = chunkEntry.header.calcAlignmentGetBinSize() + chunkEntry.data.size();
				seen.insert(std::make_pair(std::move(chunk), std::make_pair(headerEntry.offset, headerEntry.size)));
				pos += headerEntry.size;
			} else {
				headerEntry.offset = found->second.first;
				headerEntry.size = found->second.second;
			}
		}
	}

	header.filesize = pos;
	header.write(output, in);
	for (auto& chunk : data) {
		output.seekp(chunk.offset, output.beg);
		output << chunk.header;
		output.write(reinterpret_cast<char*>(chunk.data.data()), chunk.data.size());
	}
	return 0;
}